

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O2

void __thiscall quantum::QuantumComputer::displayInfo(QuantumComputer *this)

{
  pointer pdVar1;
  ostream *poVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pdVar6;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"*****");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Information about state");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Current register size(qubits): ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->registerSize);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Register is normalized: ");
  pcVar5 = "false";
  pcVar4 = "false";
  if (this->isNormalize != false) {
    pcVar4 = "true";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Register is measured: ");
  if (this->isMeasured != false) {
    pcVar5 = "true";
  }
  poVar2 = std::operator<<(poVar2,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size of baseVector: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Values in baseVector array: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  pdVar1 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (pdVar6 = (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar1; pdVar6 = pdVar6 + 1) {
    printf("  index [%d] value [%.4f] \n",*pdVar6,(ulong)uVar3);
    uVar3 = uVar3 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"*****");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void quantum::QuantumComputer::displayInfo() {



    std::cout << "*****" << std::endl;
    std::cout << "Information about state" << std::endl;
    std::cout << "Current register size(qubits): " << this->registerSize << std::endl;
    std::cout << "Register is normalized: " << boolToString(this->isNormalize) << std::endl;
    std::cout << "Register is measured: " << boolToString(this->isMeasured) << std::endl;
    std::cout << "Size of baseVector: " << this->baseVector.size() << std::endl;
    std::cout << "Values in baseVector array: " << std::endl;
    int i = 0;
    for (auto x: this->baseVector) {
        printf("  index [%d] value [%.4f] \n",i, x);
        i++;
    }
    std::cout << "*****" << std::endl;
}